

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall
AccelParam::StartSpeedControl
          (AccelParam *this,double _startSpeed,double _targetSpeed,double _deltaDist,
          double _startTime,double _targetTime,LTAircraft *pAc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LTFlightData *pLVar2;
  size_t __n;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  string local_50;
  
  if (_targetTime <= _startTime) {
    return;
  }
  if (_targetTime <= currCycle.simTime) {
    return;
  }
  bVar4 = dequal(_deltaDist,0.0);
  if (!bVar4) {
    dVar6 = _targetTime - _startTime;
    bVar4 = dequal(dVar6,0.0);
    if (!bVar4) {
      dVar8 = _deltaDist / dVar6;
      if ((_startSpeed <= dVar8) || (dVar8 <= _targetSpeed)) {
        if ((_startSpeed < dVar8) && (dVar8 < _targetSpeed)) {
          dVar7 = dVar8 - (_targetSpeed - dVar8);
          if (_startSpeed < dVar7) {
            _startSpeed = dVar7;
          }
          goto LAB_0014e7b9;
        }
        if (dataRefs.bDebugAcPos != 0) {
          pLVar2 = pAc->fd;
          paVar1 = &local_50.field_2;
          if (dataRefs.uDebugAcFilter == 0) {
            local_50._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,dataRefs.keyAc._M_dataplus._M_p,
                       dataRefs.keyAc._M_dataplus._M_p + dataRefs.keyAc._M_string_length);
          }
          else {
            DataRefs::GetDebugAcFilter_abi_cxx11_(&local_50,&dataRefs);
          }
          _Var3._M_p = local_50._M_dataplus._M_p;
          __n = (pLVar2->acKey).key._M_string_length;
          if (__n == local_50._M_string_length) {
            if (__n == 0) {
              bVar4 = true;
            }
            else {
              iVar5 = bcmp((pLVar2->acKey).key._M_dataplus._M_p,local_50._M_dataplus._M_p,__n);
              bVar4 = iVar5 == 0;
            }
          }
          else {
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != paVar1) {
            operator_delete(_Var3._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((bool)(bVar4 & (int)dataRefs.iLogLevel < 1)) {
            LTAircraft::operator_cast_to_string(&local_50,pAc);
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
                   ,0x1d3,"StartSpeedControl",logDEBUG,
                   "CONSTANT SPEED due impossible speeds (start=%.1f,avg=%.1f=%.1fm/%.1fs,target=%.1f) for %s"
                   ,_startSpeed,dVar8,_deltaDist,dVar6,_targetSpeed,local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      else {
        dVar7 = (dVar8 - _targetSpeed) + dVar8;
        if (dVar7 < _startSpeed) {
          _startSpeed = dVar7;
        }
LAB_0014e7b9:
        dVar7 = _targetSpeed - _startSpeed;
        dVar6 = ((dVar6 * _startSpeed + dVar7 * 0.5 * _targetTime) - _deltaDist) * (2.0 / dVar7);
        if (dVar6 <= _targetTime) {
          this->currSpeed_m_s = _startSpeed;
          this->currSpeed_kt = _startSpeed * 1.94384;
          this->startSpeed = _startSpeed;
          this->targetSpeed = _targetSpeed;
          this->acceleration = dVar7 / (_targetTime - dVar6);
          this->targetDeltaDist = _deltaDist;
          this->startTime = _startTime;
          if (_startTime <= dVar6) {
            _startTime = dVar6;
          }
          this->accelStartTime = _startTime;
          this->targetTime = _targetTime;
          return;
        }
        if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
                 ,0x1f7,"StartSpeedControl",logERR,
                 "tx <= _targetTime violated for %s (tx = %.1f | %.1f, %.1f, %.1f, %.1f, %.1f)",
                 (pAc->fd->acKey).key._M_dataplus._M_p);
        }
      }
      this->currSpeed_m_s = dVar8;
      this->currSpeed_kt = dVar8 * 1.94384;
      goto LAB_0014e708;
    }
  }
  this->currSpeed_m_s = _targetSpeed;
  this->currSpeed_kt = _targetSpeed * 1.94384;
LAB_0014e708:
  this->startSpeed = NAN;
  this->targetSpeed = NAN;
  this->acceleration = NAN;
  this->targetDeltaDist = NAN;
  this->targetTime = NAN;
  this->startTime = NAN;
  this->accelStartTime = NAN;
  return;
}

Assistant:

void AccelParam::StartSpeedControl(double _startSpeed, double _targetSpeed,
                                   double _deltaDist,
                                   double _startTime, double _targetTime,
                                   const LTAircraft* pAc)
{
    // Sanity checks
    if (_targetTime <= currCycle.simTime || _startTime >= _targetTime)
        return;

    const double deltaTime = _targetTime - _startTime;
    const double avgSpeed = _deltaDist / deltaTime;
    
    // Sanity checks: ∆distance and ∆t should not be too close to zero
    if (dequal(_deltaDist, 0) || dequal(deltaTime, 0)) {
        SetSpeed(_targetSpeed);
        return;
    }

    // If current speed and target speed are on opposite sides of
    // average speed then we can continue with current speed
    // up to a point from which we accelerate/decelerate to 'to'-position
    // (formula documentation see Notes.txt)
    // tx =  2/∆v * (vi * ∆t + ∆v/2 * tt - d)
    
    // decelerate (currently above avg, target below avg: keep current speed
    // until it is time [tx] to deceleration)
    if (_startSpeed > avgSpeed && avgSpeed > _targetSpeed)
    {
        // is startSpeed too fast? (too far on the other side of average?)
        if (_startSpeed > avgSpeed + (avgSpeed - _targetSpeed))
            // too fast, so we reduce startSpart to mirror targetSpeed on the other side of average speed
            _startSpeed = avgSpeed + (avgSpeed - _targetSpeed);
    }
    // accelerate (currently below avg, target above)
    else if (_startSpeed < avgSpeed && avgSpeed < _targetSpeed)
    {
        // is startSpeed too slow? (too far on the other side of average?)
        if (_startSpeed < avgSpeed - (_targetSpeed - avgSpeed))
            // too slow, increase to mirror targetSPeed
            _startSpeed = avgSpeed - (_targetSpeed - avgSpeed);
        
    }
    // no way of complying to input parameters under our conditions:
    // set constant speed and return
    else {
        // output debug info on request
        if (dataRefs.GetDebugAcPos(pAc->key())) {
            LOG_MSG(logDEBUG,"CONSTANT SPEED due impossible speeds (start=%.1f,avg=%.1f=%.1fm/%.1fs,target=%.1f) for %s",
                    _startSpeed,
                    avgSpeed, _deltaDist, deltaTime,
                    _targetSpeed,
                    std::string(*pAc).c_str());
        }
        SetSpeed(avgSpeed);
        return;
    }
    
    // continue with dynamic speed:
    // calc the time when to start speed change
    const double deltaSpeed = _targetSpeed - _startSpeed;
    const double tx = 2/deltaSpeed * (_startSpeed * deltaTime +
                         deltaSpeed/2 * _targetTime -
                         _deltaDist);
    const double accel = deltaSpeed / (_targetTime - tx);
    
    // set object's values
    if (tx <= _targetTime) {            // expected...but in rare edge cases it seems possible to be violated
        SetSpeed(_startSpeed);          // reset, then set to calculated values:
        startSpeed = _startSpeed;
        targetSpeed = _targetSpeed;
        acceleration = accel;
        targetDeltaDist = _deltaDist;
        startTime = _startTime;
        accelStartTime = std::max(tx, _startTime);
        targetTime = _targetTime;
    //    if (dataRefs.GetDebugAcPos(pAc->key())) {
    //        LOG_MSG(logDEBUG,"%s: start=%.1f, in %.1fs: accel=%.1f,target=%.1f) for %s",
    //                acceleration >= 0.0 ? "ACCELERATION" : "DECELERATION",
    //                startSpeed,
    //                accelStartTime - startTime,
    //                acceleration,
    //                targetSpeed,
    //                std::string(*pAc).c_str());
    //    }
    } else {
        LOG_MSG(logERR, "tx <= _targetTime violated for %s (tx = %.1f | %.1f, %.1f, %.1f, %.1f, %.1f)",
                pAc->key().c_str(), tx,
                _startSpeed, _targetSpeed, _deltaDist, _startTime, _targetTime);
        SetSpeed(avgSpeed);
        return;
    }
}